

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimedMachine.hpp
# Opt level: O2

void __thiscall
MachineTypes::TimedMachine::set_speed_multiplier(TimedMachine *this,double multiplier)

{
  undefined8 *puVar1;
  Speaker *this_00;
  
  if ((this->speed_multiplier_ != multiplier) || (NAN(this->speed_multiplier_) || NAN(multiplier)))
  {
    this->speed_multiplier_ = multiplier;
    puVar1 = (undefined8 *)
             __dynamic_cast(this,&typeinfo,&AudioProducer::typeinfo,0xfffffffffffffffe);
    if (puVar1 != (undefined8 *)0x0) {
      this_00 = (Speaker *)(**(code **)*puVar1)(puVar1);
      if (this_00 != (Speaker *)0x0) {
        this_00->input_rate_multiplier_ = (float)multiplier;
        Outputs::Speaker::Speaker::compute_output_rate(this_00);
        return;
      }
    }
  }
  return;
}

Assistant:

virtual void set_speed_multiplier(double multiplier) {
			if(speed_multiplier_ == multiplier) {
				return;
			}

			speed_multiplier_ = multiplier;

			auto audio_producer = dynamic_cast<AudioProducer *>(this);
			if(!audio_producer) return;

			auto speaker = audio_producer->get_speaker();
			if(speaker) {
				speaker->set_input_rate_multiplier(float(multiplier));
			}
		}